

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void QHashPrivate::Node<void_const*,QCss::StyleSheet>::createInPlace<QCss::StyleSheet_const&>
               (Node<const_void_*,_QCss::StyleSheet> *n,void **k,StyleSheet *args)

{
  StyleSheet *in_RDX;
  StyleSheet *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = (in_RSI->styleRules).d.d;
  QCss::StyleSheet::StyleSheet(in_RSI,in_RDX);
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }